

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_expr.cc
# Opt level: O3

bool __thiscall Expr::RequiresAnalyzerContext(Expr *this)

{
  ExprType EVar1;
  CaseExprList *pCVar2;
  ExprList *pEVar3;
  bool bVar4;
  int iVar5;
  pointer ppCVar6;
  pointer ppEVar7;
  long lVar8;
  
  for (; EVar1 = this->expr_type_, EVar1 == EXPR_MEMBER; this = this->operand_[0]) {
  }
  if (EVar1 == EXPR_ID) {
    iVar5 = std::__cxx11::string::compare((char *)&this->id_->name);
    bVar4 = iVar5 == 0;
  }
  else {
    if (EVar1 == EXPR_CALLARGS) {
      pEVar3 = this->args_;
      if ((pEVar3 != (ExprList *)0x0) &&
         (ppEVar7 = (pEVar3->super__Vector_base<Expr_*,_std::allocator<Expr_*>_>)._M_impl.
                    super__Vector_impl_data._M_start,
         ppEVar7 !=
         (pEVar3->super__Vector_base<Expr_*,_std::allocator<Expr_*>_>)._M_impl.
         super__Vector_impl_data._M_finish)) {
        do {
          bVar4 = RequiresAnalyzerContext(*ppEVar7);
          if (bVar4) {
            return bVar4;
          }
          ppEVar7 = ppEVar7 + 1;
        } while (ppEVar7 !=
                 (this->args_->super__Vector_base<Expr_*,_std::allocator<Expr_*>_>)._M_impl.
                 super__Vector_impl_data._M_finish);
        return bVar4;
      }
    }
    else if (EVar1 == EXPR_CASE) {
      pCVar2 = this->cases_;
      if ((pCVar2 != (CaseExprList *)0x0) &&
         (ppCVar6 = (pCVar2->super__Vector_base<CaseExpr_*,_std::allocator<CaseExpr_*>_>)._M_impl.
                    super__Vector_impl_data._M_start,
         ppCVar6 !=
         (pCVar2->super__Vector_base<CaseExpr_*,_std::allocator<CaseExpr_*>_>)._M_impl.
         super__Vector_impl_data._M_finish)) {
        do {
          bVar4 = RequiresAnalyzerContext((*ppCVar6)->value_);
          if (bVar4) {
            return bVar4;
          }
          ppCVar6 = ppCVar6 + 1;
        } while (ppCVar6 !=
                 (this->cases_->super__Vector_base<CaseExpr_*,_std::allocator<CaseExpr_*>_>)._M_impl
                 .super__Vector_impl_data._M_finish);
        return bVar4;
      }
    }
    else {
      lVar8 = 0;
      do {
        if ((this->operand_[lVar8] != (Expr *)0x0) &&
           (bVar4 = RequiresAnalyzerContext(this->operand_[lVar8]), bVar4)) {
          if (FLAGS_pac_debug != true) {
            return true;
          }
          fprintf(_stderr,"\'%s\' requires analyzer context\n",
                  (this->operand_[lVar8]->orig_)._M_dataplus._M_p);
          return true;
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != 3);
    }
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool Expr::RequiresAnalyzerContext() const
	{
	switch ( expr_type_ )
		{
		case EXPR_ID:
			return *id_ == *analyzer_context_id;

		case EXPR_MEMBER:
			/*
			For member expressions such X.Y, evaluating
			X only is sufficient. (Actually trying to
			evaluate Y will lead to error because Y is
			not defined in the current environment.)
			*/
			return operand_[0]->RequiresAnalyzerContext();

		case EXPR_CALLARGS:
			{
			foreach (i, ExprList, args_)
				if ( (*i)->RequiresAnalyzerContext() )
					return true;
			}
			return false;

		case EXPR_CASE:
			{
			foreach (i, CaseExprList, cases_)
				if ( (*i)->RequiresAnalyzerContext() )
					return true;
			}
			return false;

		default:
			// Evaluate every operand by default
			for ( int i = 0; i < 3; ++i )
				if ( operand_[i] && operand_[i]->RequiresAnalyzerContext() )
					{
					DEBUG_MSG("'%s' requires analyzer context\n", operand_[i]->orig());
					return true;
					}
			return false;
		}
	}